

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-amiga.cc
# Opt level: O0

PSpriteAmiga __thiscall
DataSourceAmiga::SpriteAmiga::merge_horizontaly(SpriteAmiga *this,PSpriteAmiga *right)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  __shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  PSpriteAmiga PVar4;
  ulong local_60;
  size_t x_1;
  size_t x;
  size_t y;
  uint32_t *res;
  uint32_t *src_r;
  uint32_t *src_l;
  undefined1 local_21;
  PSpriteAmiga *right_local;
  SpriteAmiga *this_local;
  PSpriteAmiga *result;
  
  right_local = right;
  this_local = this;
  peVar2 = std::
           __shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(in_RDX);
  if ((element_type *)(peVar2->super_SpriteBase).height ==
      right[3].super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  {
    local_21 = 0;
    p_Var1 = right[2].super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    peVar2 = std::
             __shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(in_RDX);
    src_l = (uint32_t *)((long)&p_Var1->_vptr__Sp_counted_base + (peVar2->super_SpriteBase).width);
    std::make_shared<DataSourceAmiga::SpriteAmiga,unsigned_long,unsigned_long&>
              ((unsigned_long *)this,(unsigned_long *)&src_l);
    src_r = (uint32_t *)
            right[3].super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
    peVar2 = std::
             __shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(in_RDX);
    res = (uint32_t *)(peVar2->super_SpriteBase).data;
    peVar2 = std::
             __shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    y = (size_t)(peVar2->super_SpriteBase).data;
    _Var3._M_pi = extraout_RDX_00;
    for (x = 0; x < right[3].
                    super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr; x = x + 1) {
      for (x_1 = 0; x_1 < right[2].
                          super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi; x_1 = x_1 + 1) {
        *(uint32_t *)y = *src_r;
        y = y + 4;
        src_r = src_r + 1;
      }
      for (local_60 = 0;
          peVar2 = std::
                   __shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->(in_RDX), local_60 < (peVar2->super_SpriteBase).width;
          local_60 = local_60 + 1) {
        *(uint32_t *)y = *res;
        y = y + 4;
        res = res + 1;
      }
      _Var3._M_pi = extraout_RDX_01;
    }
  }
  else {
    std::shared_ptr<DataSourceAmiga::SpriteAmiga>::shared_ptr
              ((shared_ptr<DataSourceAmiga::SpriteAmiga> *)this,(nullptr_t)0x0);
    _Var3._M_pi = extraout_RDX;
  }
  PVar4.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  PVar4.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (PSpriteAmiga)
         PVar4.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

DataSourceAmiga::PSpriteAmiga
DataSourceAmiga::SpriteAmiga::merge_horizontaly(PSpriteAmiga right) {
  if (right->height != height) {
    return nullptr;
  }

  PSpriteAmiga result = std::make_shared<SpriteAmiga>(width + right->width,
                                                      height);

  uint32_t *src_l = reinterpret_cast<uint32_t*>(data);
  uint32_t *src_r = reinterpret_cast<uint32_t*>(right->data);
  uint32_t *res = reinterpret_cast<uint32_t*>(result->data);
  for (size_t y = 0; y < height; y++) {
    for (size_t x = 0; x < width; x++) {
      *res++ = *src_l++;
    }
    for (size_t x = 0; x < right->width; x++) {
      *res++ = *src_r++;
    }
  }

  return result;
}